

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

int match_idents(dmr_C *C,token *token,...)

{
  char *pcVar1;
  char in_AL;
  undefined8 in_RCX;
  uint uVar2;
  undefined8 in_RDX;
  long *plVar3;
  ulong uVar4;
  long *plVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  long local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  va_list args;
  
  local_d8[2] = in_RDX;
  local_d8[3] = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  uVar2 = 0;
  if (((ulong)token->pos & 0x3f) == 2) {
    args[0].overflow_arg_area = local_d8;
    plVar3 = (long *)&stack0x00000008;
    args[0]._0_8_ = plVar3;
    local_28 = 0x3000000010;
    uVar2 = 0x10;
    do {
      if (uVar2 < 0x29) {
        uVar4 = (ulong)uVar2;
        uVar2 = uVar2 + 8;
        local_28 = CONCAT44(local_28._4_4_,uVar2);
        plVar5 = (long *)((long)local_d8 + uVar4);
      }
      else {
        args[0]._0_8_ = plVar3 + 1;
        plVar5 = plVar3;
        plVar3 = plVar3 + 1;
      }
      pcVar1 = (char *)*plVar5;
      if (pcVar1 == (char *)0x0) {
        return 0;
      }
    } while ((token->field_2).number != pcVar1);
    uVar2 = (uint)((token->field_2).number == pcVar1);
  }
  return uVar2;
}

Assistant:

static int SENTINEL_ATTR match_idents(struct dmr_C *C, struct token *token, ...)
{
	va_list args;
	struct ident * next;
        
        (void) C;

	if (dmrC_token_type(token) != TOKEN_IDENT)
		return 0;

	va_start(args, token);
	do {
		next = va_arg(args, struct ident *);
	} while (next && token->ident != next);
	va_end(args);

	return next && token->ident == next;
}